

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::clearColor
          (ReadPixelsTest *this,float r,float g,float b,float a)

{
  GLenum GVar1;
  int iVar2;
  undefined4 in_ESI;
  char *msg;
  GLfloat color [4];
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  if ((int)this == 1) {
    switch(in_ESI) {
    case 1:
      glwClearColor(r,g,b,a);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glClearColor(r, g, b, a)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                      ,0x159);
      glwClear(0x4000);
      GVar1 = glwGetError();
      iVar2 = 0x15a;
      goto LAB_01170d9f;
    case 2:
      local_18 = (float)(int)r;
      fStack_14 = (float)(int)g;
      fStack_10 = (float)(int)b;
      fStack_c = (float)(int)a;
      glwClearBufferiv(0x1800,0,(GLint *)&local_18);
      GVar1 = glwGetError();
      msg = "glClearBufferiv(GL_COLOR, 0, color)";
      iVar2 = 0x162;
      break;
    case 3:
      local_18 = (float)((int)(r - 2.1474836e+09) & (int)r >> 0x1f | (int)r);
      fStack_14 = (float)((int)(g - 2.1474836e+09) & (int)g >> 0x1f | (int)g);
      fStack_10 = (float)((int)(b - 2.1474836e+09) & (int)b >> 0x1f | (int)b);
      fStack_c = (float)((int)(a - 2.1474836e+09) & (int)a >> 0x1f | (int)a);
      glwClearBufferuiv(0x1800,0,(GLuint *)&local_18);
      GVar1 = glwGetError();
      msg = "glClearBufferuiv(GL_COLOR, 0, color)";
      iVar2 = 0x16a;
      break;
    case 4:
      local_18 = r;
      fStack_14 = g;
      fStack_10 = b;
      fStack_c = a;
      glwClearBufferfv(0x1800,0,&local_18);
      GVar1 = glwGetError();
      msg = "glClearBufferfv(GL_COLOR, 0, color)";
      iVar2 = 0x172;
      break;
    default:
      goto switchD_01170dc2_default;
    }
    glu::checkError(GVar1,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                    ,iVar2);
  }
  else if ((int)this == 0) {
    glwClearColor(r,g,b,a);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glClearColor(r, g, b, a)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                    ,0x150);
    glwClear(0x4000);
    GVar1 = glwGetError();
    iVar2 = 0x151;
LAB_01170d9f:
    glu::checkError(GVar1,"glClear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                    ,iVar2);
    return;
  }
switchD_01170dc2_default:
  return;
}

Assistant:

void ReadPixelsTest::clearColor (float r, float g, float b, float a)
{
	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
	{
		GLU_CHECK_CALL(glClearColor(r, g, b, a));
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	}
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			{
				GLU_CHECK_CALL(glClearColor(r, g, b, a));
				GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
				break;
			}

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			{
				GLint color[4] = { (GLint)r, (GLint)g, (GLint)b, (GLint)a };

				GLU_CHECK_CALL(glClearBufferiv(GL_COLOR, 0, color));
				break;
			}

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			{
				GLuint color[4] = { (GLuint)r, (GLuint)g, (GLuint)b, (GLuint)a };

				GLU_CHECK_CALL(glClearBufferuiv(GL_COLOR, 0, color));
				break;
			}

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			{
				GLfloat color[4] = { (GLfloat)r, (GLfloat)g, (GLfloat)b, (GLfloat)a };

				GLU_CHECK_CALL(glClearBufferfv(GL_COLOR, 0, color));
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);

}